

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  Geometry *this;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  size_t i;
  long lVar17;
  undefined4 uVar18;
  ulong unaff_R15;
  undefined4 uVar20;
  long lVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar44;
  float fVar45;
  undefined1 auVar40 [16];
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar55;
  float fVar56;
  undefined1 auVar54 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028 [4];
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  local_1038._4_4_ = (query->p).field_0.field_0.x;
  local_1048._4_4_ = (query->p).field_0.field_0.y;
  local_1058._4_4_ = (query->p).field_0.field_0.z;
  fVar39 = (context->query_radius).field_0.m128[0];
  fVar44 = (context->query_radius).field_0.m128[1];
  fVar45 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_f98 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_f98 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  local_1038._0_4_ = local_1038._4_4_;
  fStack_1030 = (float)local_1038._4_4_;
  fStack_102c = (float)local_1038._4_4_;
  local_1048._0_4_ = local_1048._4_4_;
  fStack_1040 = (float)local_1048._4_4_;
  fStack_103c = (float)local_1048._4_4_;
  local_1058._0_4_ = local_1058._4_4_;
  fStack_1050 = (float)local_1058._4_4_;
  fStack_104c = (float)local_1058._4_4_;
  bVar10 = false;
  local_1018 = unaff_R15;
  do {
    local_fc8 = (float)local_1038._4_4_ - fVar39;
    fStack_fc4 = (float)local_1038._4_4_ - fVar39;
    fStack_fc0 = (float)local_1038._4_4_ - fVar39;
    fStack_fbc = (float)local_1038._4_4_ - fVar39;
    local_fd8 = (float)local_1038._4_4_ + fVar39;
    fStack_fd4 = (float)local_1038._4_4_ + fVar39;
    fStack_fd0 = (float)local_1038._4_4_ + fVar39;
    fStack_fcc = (float)local_1038._4_4_ + fVar39;
    local_fe8._0_4_ = (float)local_1048._4_4_ - fVar44;
    local_fe8._4_4_ = (float)local_1048._4_4_ - fVar44;
    fStack_fe0 = (float)local_1048._4_4_ - fVar44;
    fStack_fdc = (float)local_1048._4_4_ - fVar44;
    local_fa8 = fVar44 + (float)local_1048._4_4_;
    fStack_fa4 = fVar44 + (float)local_1048._4_4_;
    fStack_fa0 = fVar44 + (float)local_1048._4_4_;
    fStack_f9c = fVar44 + (float)local_1048._4_4_;
    local_ff8._0_4_ = (float)local_1058._4_4_ - fVar45;
    local_ff8._4_4_ = (float)local_1058._4_4_ - fVar45;
    fStack_ff0 = (float)local_1058._4_4_ - fVar45;
    fStack_fec = (float)local_1058._4_4_ - fVar45;
    local_fb8._0_4_ = fVar45 + (float)local_1058._4_4_;
    local_fb8._4_4_ = fVar45 + (float)local_1058._4_4_;
    fStack_fb0 = fVar45 + (float)local_1058._4_4_;
    fStack_fac = fVar45 + (float)local_1058._4_4_;
    local_f88._0_4_ = fVar39 * fVar39;
    local_f88._4_4_ = fVar39 * fVar39;
    fStack_f80 = fVar39 * fVar39;
    fStack_f7c = fVar39 * fVar39;
    auVar62 = local_f98;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar10;
          }
          pauVar8 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (auVar62._0_4_ < *(float *)(*pauVar8 + 8));
        uVar13 = *(ulong *)*local_1010;
        do {
          uVar20 = (undefined4)(local_1018 >> 0x20);
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar13 & 8) == 0) {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              fVar39 = query->time;
              auVar32._4_4_ = fVar39;
              auVar32._0_4_ = fVar39;
              auVar32._8_4_ = fVar39;
              auVar32._12_4_ = fVar39;
              auVar30._0_4_ = *(float *)(uVar12 + 0x80) * fVar39 + *(float *)(uVar12 + 0x20);
              auVar30._4_4_ = *(float *)(uVar12 + 0x84) * fVar39 + *(float *)(uVar12 + 0x24);
              auVar30._8_4_ = *(float *)(uVar12 + 0x88) * fVar39 + *(float *)(uVar12 + 0x28);
              auVar30._12_4_ = *(float *)(uVar12 + 0x8c) * fVar39 + *(float *)(uVar12 + 0x2c);
              auVar40._0_4_ = *(float *)(uVar12 + 0xa0) * fVar39 + *(float *)(uVar12 + 0x40);
              auVar40._4_4_ = *(float *)(uVar12 + 0xa4) * fVar39 + *(float *)(uVar12 + 0x44);
              auVar40._8_4_ = *(float *)(uVar12 + 0xa8) * fVar39 + *(float *)(uVar12 + 0x48);
              auVar40._12_4_ = *(float *)(uVar12 + 0xac) * fVar39 + *(float *)(uVar12 + 0x4c);
              auVar35._0_4_ = *(float *)(uVar12 + 0xc0) * fVar39 + *(float *)(uVar12 + 0x60);
              auVar35._4_4_ = *(float *)(uVar12 + 0xc4) * fVar39 + *(float *)(uVar12 + 100);
              auVar35._8_4_ = *(float *)(uVar12 + 200) * fVar39 + *(float *)(uVar12 + 0x68);
              auVar35._12_4_ = *(float *)(uVar12 + 0xcc) * fVar39 + *(float *)(uVar12 + 0x6c);
              auVar33._0_4_ = *(float *)(uVar12 + 0x90) * fVar39 + *(float *)(uVar12 + 0x30);
              auVar33._4_4_ = *(float *)(uVar12 + 0x94) * fVar39 + *(float *)(uVar12 + 0x34);
              auVar33._8_4_ = *(float *)(uVar12 + 0x98) * fVar39 + *(float *)(uVar12 + 0x38);
              auVar33._12_4_ = *(float *)(uVar12 + 0x9c) * fVar39 + *(float *)(uVar12 + 0x3c);
              auVar47._0_4_ = *(float *)(uVar12 + 0xb0) * fVar39 + *(float *)(uVar12 + 0x50);
              auVar47._4_4_ = *(float *)(uVar12 + 0xb4) * fVar39 + *(float *)(uVar12 + 0x54);
              auVar47._8_4_ = *(float *)(uVar12 + 0xb8) * fVar39 + *(float *)(uVar12 + 0x58);
              auVar47._12_4_ = *(float *)(uVar12 + 0xbc) * fVar39 + *(float *)(uVar12 + 0x5c);
              auVar51._0_4_ = *(float *)(uVar12 + 0xd0) * fVar39 + *(float *)(uVar12 + 0x70);
              auVar51._4_4_ = *(float *)(uVar12 + 0xd4) * fVar39 + *(float *)(uVar12 + 0x74);
              auVar51._8_4_ = *(float *)(uVar12 + 0xd8) * fVar39 + *(float *)(uVar12 + 0x78);
              auVar51._12_4_ = *(float *)(uVar12 + 0xdc) * fVar39 + *(float *)(uVar12 + 0x7c);
              auVar54 = maxps(_local_1038,auVar30);
              auVar54 = minps(auVar54,auVar33);
              fVar53 = auVar54._0_4_ - (float)local_1038._4_4_;
              fVar55 = auVar54._4_4_ - (float)local_1038._4_4_;
              fVar56 = auVar54._8_4_ - (float)local_1038._4_4_;
              fVar57 = auVar54._12_4_ - (float)local_1038._4_4_;
              auVar54 = maxps(_local_1048,auVar40);
              auVar54 = minps(auVar54,auVar47);
              fVar58 = auVar54._0_4_ - (float)local_1048._4_4_;
              fVar59 = auVar54._4_4_ - (float)local_1048._4_4_;
              fVar60 = auVar54._8_4_ - (float)local_1048._4_4_;
              fVar61 = auVar54._12_4_ - (float)local_1048._4_4_;
              auVar54 = maxps(_local_1058,auVar35);
              auVar54 = minps(auVar54,auVar51);
              fVar39 = auVar54._0_4_ - (float)local_1058._4_4_;
              fVar44 = auVar54._4_4_ - (float)local_1058._4_4_;
              fVar45 = auVar54._8_4_ - (float)local_1058._4_4_;
              fVar46 = auVar54._12_4_ - (float)local_1058._4_4_;
              local_1028[0] = fVar39 * fVar39 + fVar58 * fVar58 + fVar53 * fVar53;
              local_1028[1] = fVar44 * fVar44 + fVar59 * fVar59 + fVar55 * fVar55;
              local_1028[2] = fVar45 * fVar45 + fVar60 * fVar60 + fVar56 * fVar56;
              local_1028[3] = fVar46 * fVar46 + fVar61 * fVar61 + fVar57 * fVar57;
              auVar38._0_4_ =
                   -(uint)(auVar30._0_4_ <= auVar33._0_4_ && local_1028[0] <= (float)local_f88._0_4_
                          );
              auVar38._4_4_ =
                   -(uint)(auVar30._4_4_ <= auVar33._4_4_ && local_1028[1] <= (float)local_f88._4_4_
                          );
              auVar38._8_4_ = -(uint)(auVar30._8_4_ <= auVar33._8_4_ && local_1028[2] <= fStack_f80)
              ;
              auVar38._12_4_ =
                   -(uint)(auVar30._12_4_ <= auVar33._12_4_ && local_1028[3] <= fStack_f7c);
              if (((uint)uVar13 & 7) != 6) goto LAB_00e83b13;
LAB_00e83ca1:
              uVar12 = uVar13 & 0xfffffffffffffff0;
              auVar21._0_4_ =
                   (-(uint)(auVar32._0_4_ < *(float *)(uVar12 + 0xf0) &&
                           *(float *)(uVar12 + 0xe0) <= auVar32._0_4_) & auVar38._0_4_) << 0x1f;
              auVar21._4_4_ =
                   (-(uint)(auVar32._4_4_ < *(float *)(uVar12 + 0xf4) &&
                           *(float *)(uVar12 + 0xe4) <= auVar32._4_4_) & auVar38._4_4_) << 0x1f;
              auVar21._8_4_ =
                   (-(uint)(auVar32._8_4_ < *(float *)(uVar12 + 0xf8) &&
                           *(float *)(uVar12 + 0xe8) <= auVar32._8_4_) & auVar38._8_4_) << 0x1f;
              auVar21._12_4_ =
                   (-(uint)(auVar32._12_4_ < *(float *)(uVar12 + 0xfc) &&
                           *(float *)(uVar12 + 0xec) <= auVar32._12_4_) & auVar38._12_4_) << 0x1f;
              uVar18 = movmskps((int)local_1018,auVar21);
              local_1018 = CONCAT44(uVar20,uVar18);
            }
          }
          else if ((uVar13 & 8) == 0) {
            uVar12 = uVar13 & 0xfffffffffffffff0;
            fVar39 = query->time;
            auVar32._4_4_ = fVar39;
            auVar32._0_4_ = fVar39;
            auVar32._8_4_ = fVar39;
            auVar32._12_4_ = fVar39;
            auVar50._0_4_ = *(float *)(uVar12 + 0x80) * fVar39 + *(float *)(uVar12 + 0x20);
            auVar50._4_4_ = *(float *)(uVar12 + 0x84) * fVar39 + *(float *)(uVar12 + 0x24);
            auVar50._8_4_ = *(float *)(uVar12 + 0x88) * fVar39 + *(float *)(uVar12 + 0x28);
            auVar50._12_4_ = *(float *)(uVar12 + 0x8c) * fVar39 + *(float *)(uVar12 + 0x2c);
            auVar43._0_4_ = *(float *)(uVar12 + 0xa0) * fVar39 + *(float *)(uVar12 + 0x40);
            auVar43._4_4_ = *(float *)(uVar12 + 0xa4) * fVar39 + *(float *)(uVar12 + 0x44);
            auVar43._8_4_ = *(float *)(uVar12 + 0xa8) * fVar39 + *(float *)(uVar12 + 0x48);
            auVar43._12_4_ = *(float *)(uVar12 + 0xac) * fVar39 + *(float *)(uVar12 + 0x4c);
            auVar54._0_4_ = *(float *)(uVar12 + 0xc0) * fVar39 + *(float *)(uVar12 + 0x60);
            auVar54._4_4_ = *(float *)(uVar12 + 0xc4) * fVar39 + *(float *)(uVar12 + 100);
            auVar54._8_4_ = *(float *)(uVar12 + 200) * fVar39 + *(float *)(uVar12 + 0x68);
            auVar54._12_4_ = *(float *)(uVar12 + 0xcc) * fVar39 + *(float *)(uVar12 + 0x6c);
            auVar41._0_4_ = *(float *)(uVar12 + 0x90) * fVar39 + *(float *)(uVar12 + 0x30);
            auVar41._4_4_ = *(float *)(uVar12 + 0x94) * fVar39 + *(float *)(uVar12 + 0x34);
            auVar41._8_4_ = *(float *)(uVar12 + 0x98) * fVar39 + *(float *)(uVar12 + 0x38);
            auVar41._12_4_ = *(float *)(uVar12 + 0x9c) * fVar39 + *(float *)(uVar12 + 0x3c);
            auVar52._0_4_ = *(float *)(uVar12 + 0xb0) * fVar39 + *(float *)(uVar12 + 0x50);
            auVar52._4_4_ = *(float *)(uVar12 + 0xb4) * fVar39 + *(float *)(uVar12 + 0x54);
            auVar52._8_4_ = *(float *)(uVar12 + 0xb8) * fVar39 + *(float *)(uVar12 + 0x58);
            auVar52._12_4_ = *(float *)(uVar12 + 0xbc) * fVar39 + *(float *)(uVar12 + 0x5c);
            auVar48._0_4_ = *(float *)(uVar12 + 0xd0) * fVar39 + *(float *)(uVar12 + 0x70);
            auVar48._4_4_ = *(float *)(uVar12 + 0xd4) * fVar39 + *(float *)(uVar12 + 0x74);
            auVar48._8_4_ = *(float *)(uVar12 + 0xd8) * fVar39 + *(float *)(uVar12 + 0x78);
            auVar48._12_4_ = *(float *)(uVar12 + 0xdc) * fVar39 + *(float *)(uVar12 + 0x7c);
            auVar38 = maxps(_local_1038,auVar50);
            auVar38 = minps(auVar38,auVar41);
            fVar39 = auVar38._0_4_ - (float)local_1038._4_4_;
            fVar45 = auVar38._4_4_ - (float)local_1038._4_4_;
            fVar53 = auVar38._8_4_ - (float)local_1038._4_4_;
            fVar56 = auVar38._12_4_ - (float)local_1038._4_4_;
            auVar38 = maxps(_local_1048,auVar43);
            auVar38 = minps(auVar38,auVar52);
            fVar58 = auVar38._0_4_ - (float)local_1048._4_4_;
            fVar59 = auVar38._4_4_ - (float)local_1048._4_4_;
            fVar60 = auVar38._8_4_ - (float)local_1048._4_4_;
            fVar61 = auVar38._12_4_ - (float)local_1048._4_4_;
            auVar38 = maxps(_local_1058,auVar54);
            auVar38 = minps(auVar38,auVar48);
            fVar44 = auVar38._0_4_ - (float)local_1058._4_4_;
            fVar46 = auVar38._4_4_ - (float)local_1058._4_4_;
            fVar55 = auVar38._8_4_ - (float)local_1058._4_4_;
            fVar57 = auVar38._12_4_ - (float)local_1058._4_4_;
            local_1028[0] = fVar44 * fVar44 + fVar58 * fVar58 + fVar39 * fVar39;
            local_1028[1] = fVar46 * fVar46 + fVar59 * fVar59 + fVar45 * fVar45;
            local_1028[2] = fVar55 * fVar55 + fVar60 * fVar60 + fVar53 * fVar53;
            local_1028[3] = fVar57 * fVar57 + fVar61 * fVar61 + fVar56 * fVar56;
            uVar6 = (uint)(((auVar54._0_4_ <= (float)local_fb8._0_4_ && local_fc8 <= auVar41._0_4_)
                           && (auVar43._0_4_ <= local_fa8 && auVar50._0_4_ <= local_fd8)) &&
                          ((float)local_ff8._0_4_ <= auVar48._0_4_ &&
                          ((float)local_fe8._0_4_ <= auVar52._0_4_ && auVar50._0_4_ <= auVar41._0_4_
                          )));
            auVar38._0_4_ = -uVar6;
            uVar7 = (uint)(((auVar54._4_4_ <= (float)local_fb8._4_4_ && fStack_fc4 <= auVar41._4_4_)
                           && (auVar43._4_4_ <= fStack_fa4 && auVar50._4_4_ <= fStack_fd4)) &&
                          ((float)local_ff8._4_4_ <= auVar48._4_4_ &&
                          ((float)local_fe8._4_4_ <= auVar52._4_4_ && auVar50._4_4_ <= auVar41._4_4_
                          )));
            auVar38._4_4_ = -uVar7;
            uVar5 = (uint)(((auVar54._8_4_ <= fStack_fb0 && fStack_fc0 <= auVar41._8_4_) &&
                           (auVar43._8_4_ <= fStack_fa0 && auVar50._8_4_ <= fStack_fd0)) &&
                          (fStack_ff0 <= auVar48._8_4_ &&
                          (fStack_fe0 <= auVar52._8_4_ && auVar50._8_4_ <= auVar41._8_4_)));
            auVar38._8_4_ = -uVar5;
            uVar2 = (uint)(((auVar54._12_4_ <= fStack_fac && fStack_fbc <= auVar41._12_4_) &&
                           (auVar43._12_4_ <= fStack_f9c && auVar50._12_4_ <= fStack_fcc)) &&
                          (fStack_fec <= auVar48._12_4_ &&
                          (fStack_fdc <= auVar52._12_4_ && auVar50._12_4_ <= auVar41._12_4_)));
            auVar38._12_4_ = -uVar2;
            if (((uint)uVar13 & 7) == 6) goto LAB_00e83ca1;
            auVar38._0_4_ = uVar6 * -0x80000000;
            auVar38._4_4_ = uVar7 * -0x80000000;
            auVar38._8_4_ = uVar5 * -0x80000000;
            auVar38._12_4_ = uVar2 * -0x80000000;
LAB_00e83b13:
            uVar18 = movmskps((int)local_1018,auVar38);
            local_1018 = CONCAT44(uVar20,uVar18);
          }
          if ((uVar13 & 8) == 0) {
            if (local_1018 == 0) {
              iVar11 = 4;
            }
            else {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              lVar16 = 0;
              if (local_1018 != 0) {
                for (; (local_1018 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              iVar11 = 0;
              uVar13 = *(ulong *)(uVar12 + lVar16 * 8);
              uVar15 = local_1018 - 1 & local_1018;
              if (uVar15 != 0) {
                fVar39 = local_1028[lVar16];
                lVar16 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar12 + lVar16 * 8);
                fVar44 = local_1028[lVar16];
                uVar15 = uVar15 - 1 & uVar15;
                if (uVar15 == 0) {
                  if ((uint)fVar39 < (uint)fVar44) {
                    *(ulong *)*local_1010 = uVar3;
                    *(float *)(*local_1010 + 8) = fVar44;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar13;
                    *(float *)(*local_1010 + 8) = fVar39;
                    local_1010 = local_1010 + 1;
                    uVar13 = uVar3;
                  }
                }
                else {
                  auVar31._8_4_ = fVar39;
                  auVar31._0_8_ = uVar13;
                  auVar31._12_4_ = 0;
                  auVar36._8_4_ = fVar44;
                  auVar36._0_8_ = uVar3;
                  auVar36._12_4_ = 0;
                  lVar16 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                    }
                  }
                  uVar4 = *(undefined8 *)(uVar12 + lVar16 * 8);
                  fVar45 = local_1028[lVar16];
                  auVar34._8_4_ = fVar45;
                  auVar34._0_8_ = uVar4;
                  auVar34._12_4_ = 0;
                  uVar15 = uVar15 - 1 & uVar15;
                  if (uVar15 == 0) {
                    auVar22._8_4_ = -(uint)((int)fVar39 < (int)fVar44);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    auVar42._8_4_ = fVar44;
                    auVar42._0_8_ = uVar3;
                    auVar42._12_4_ = 0;
                    auVar54 = blendvps(auVar42,auVar31,auVar22);
                    auVar32 = blendvps(auVar31,auVar36,auVar22);
                    auVar23._8_4_ = -(uint)(auVar54._8_4_ < (int)fVar45);
                    auVar23._4_4_ = auVar23._8_4_;
                    auVar23._0_4_ = auVar23._8_4_;
                    auVar23._12_4_ = auVar23._8_4_;
                    auVar37._8_4_ = fVar45;
                    auVar37._0_8_ = uVar4;
                    auVar37._12_4_ = 0;
                    auVar38 = blendvps(auVar37,auVar54,auVar23);
                    auVar43 = blendvps(auVar54,auVar34,auVar23);
                    auVar24._8_4_ = -(uint)(auVar32._8_4_ < auVar43._8_4_);
                    auVar24._4_4_ = auVar24._8_4_;
                    auVar24._0_4_ = auVar24._8_4_;
                    auVar24._12_4_ = auVar24._8_4_;
                    auVar54 = blendvps(auVar43,auVar32,auVar24);
                    auVar32 = blendvps(auVar32,auVar43,auVar24);
                    *local_1010 = auVar32;
                    local_1010[1] = auVar54;
                    local_1010 = local_1010 + 2;
                    uVar13 = auVar38._0_8_;
                  }
                  else {
                    lVar16 = 0;
                    if (uVar15 != 0) {
                      for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                      }
                    }
                    auVar25._8_4_ = -(uint)((int)fVar39 < (int)fVar44);
                    auVar25._4_4_ = auVar25._8_4_;
                    auVar25._0_4_ = auVar25._8_4_;
                    auVar25._12_4_ = auVar25._8_4_;
                    auVar43 = blendvps(auVar36,auVar31,auVar25);
                    auVar32 = blendvps(auVar31,auVar36,auVar25);
                    auVar49._8_4_ = local_1028[lVar16];
                    auVar49._0_8_ = *(undefined8 *)(uVar12 + lVar16 * 8);
                    auVar49._12_4_ = 0;
                    auVar26._8_4_ = -(uint)((int)fVar45 < (int)local_1028[lVar16]);
                    auVar26._4_4_ = auVar26._8_4_;
                    auVar26._0_4_ = auVar26._8_4_;
                    auVar26._12_4_ = auVar26._8_4_;
                    auVar38 = blendvps(auVar49,auVar34,auVar26);
                    auVar54 = blendvps(auVar34,auVar49,auVar26);
                    auVar27._8_4_ = -(uint)(auVar32._8_4_ < auVar54._8_4_);
                    auVar27._4_4_ = auVar27._8_4_;
                    auVar27._0_4_ = auVar27._8_4_;
                    auVar27._12_4_ = auVar27._8_4_;
                    auVar50 = blendvps(auVar54,auVar32,auVar27);
                    auVar32 = blendvps(auVar32,auVar54,auVar27);
                    auVar28._8_4_ = -(uint)(auVar43._8_4_ < auVar38._8_4_);
                    auVar28._4_4_ = auVar28._8_4_;
                    auVar28._0_4_ = auVar28._8_4_;
                    auVar28._12_4_ = auVar28._8_4_;
                    auVar54 = blendvps(auVar38,auVar43,auVar28);
                    auVar43 = blendvps(auVar43,auVar38,auVar28);
                    auVar29._8_4_ = -(uint)(auVar43._8_4_ < auVar50._8_4_);
                    auVar29._4_4_ = auVar29._8_4_;
                    auVar29._0_4_ = auVar29._8_4_;
                    auVar29._12_4_ = auVar29._8_4_;
                    auVar38 = blendvps(auVar50,auVar43,auVar29);
                    auVar43 = blendvps(auVar43,auVar50,auVar29);
                    *local_1010 = auVar32;
                    local_1010[1] = auVar43;
                    local_1010[2] = auVar38;
                    local_1010 = local_1010 + 3;
                    uVar13 = auVar54._0_8_;
                    iVar11 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar11 = 6;
          }
        } while (iVar11 == 0);
      } while ((iVar11 != 6) || (local_1008 = (ulong)((uint)uVar13 & 0xf) - 8, local_1008 == 0));
      lVar16 = (uVar13 & 0xfffffffffffffff0) + 0x50;
      lVar19 = 0;
      uVar13 = 0;
      do {
        local_1000 = uVar13;
        bVar14 = 0;
        lVar17 = 0;
        do {
          if (*(int *)(lVar16 + lVar17 * 4) == -1) break;
          uVar2 = *(uint *)(lVar16 + -0x10 + lVar17 * 4);
          this = (context->scene->geometries).items[uVar2].ptr;
          context->geomID = uVar2;
          context->primID = *(uint *)(lVar16 + lVar17 * 4);
          bVar9 = Geometry::pointQuery(this,query,context);
          bVar14 = bVar14 | bVar9;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        uVar13 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar14);
        lVar19 = lVar19 + 1;
        lVar16 = lVar16 + 0x60;
      } while (lVar19 != local_1008);
      auVar62 = local_f98;
    } while ((local_1000 & 1) == 0 && bVar14 == 0);
    auVar62 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar39 = auVar62._0_4_;
    fVar44 = auVar62._4_4_;
    fVar45 = auVar62._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f98 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_f98 = dpps(auVar62,auVar62,0x7f);
    }
    bVar10 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }